

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall
Array_MultiLineWithMultipleItems_Test::Array_MultiLineWithMultipleItems_Test
          (Array_MultiLineWithMultipleItems_Test *this)

{
  Array_MultiLineWithMultipleItems_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Array_MultiLineWithMultipleItems_Test_00227b00
  ;
  return;
}

Assistant:

TEST(Array, MultiLineWithMultipleItems) {
    std::istringstream input("key = [ \r\n 1\t \n,#comment\n \t  2 ,\r\n 3  \t # one more comment\n]");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_array},
        {sax_event_t::integer, 1},
        {sax_event_t::comment, "comment"},
        {sax_event_t::integer, 2},
        {sax_event_t::integer, 3},
        {sax_event_t::comment, " one more comment"},
        {sax_event_t::finish_array, 3},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}